

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

void __thiscall
Importer_resolveImportsOfGrandchildComponents_Test::
~Importer_resolveImportsOfGrandchildComponents_Test
          (Importer_resolveImportsOfGrandchildComponents_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, resolveImportsOfGrandchildComponents)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/nested_components.cellml"));
    auto importer = libcellml::Importer::create();

    EXPECT_TRUE(model->hasUnresolvedImports());
    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_EQ(size_t(1), importer->libraryCount());
    EXPECT_EQ(resourcePath("importer/source.cellml"), importer->key(0));
    EXPECT_FALSE(model->hasUnresolvedImports());
}